

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

IssuanceParameter * __thiscall
cfd::ConfidentialTransactionController::SetAssetReissuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransactionController *this,
          Txid *txid,uint32_t vout,Amount *amount,Script *locking_script,ByteData *asset_nonce,
          BlindFactor *blind_factor,BlindFactor *entropy,bool is_random_sort,bool is_remove_nonce)

{
  uint32_t tx_in_index;
  ConfidentialTransaction *this_00;
  ConfidentialNonce confidential_asset_nonce;
  IssuanceParameter local_a0;
  
  this_00 = &this->transaction_;
  tx_in_index = core::ConfidentialTransaction::GetTxInIndex(this_00,txid,vout);
  core::ConfidentialNonce::ConfidentialNonce(&confidential_asset_nonce);
  if (!is_remove_nonce) {
    core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&local_a0,asset_nonce);
    core::ConfidentialNonce::operator=(&confidential_asset_nonce,(ConfidentialNonce *)&local_a0);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&local_a0);
  }
  core::IssuanceParameter::IssuanceParameter(__return_storage_ptr__);
  core::ConfidentialTransaction::SetAssetReissuance
            (&local_a0,this_00,tx_in_index,amount,locking_script,&confidential_asset_nonce,
             blind_factor,entropy);
  core::IssuanceParameter::operator=(__return_storage_ptr__,&local_a0);
  core::IssuanceParameter::~IssuanceParameter(&local_a0);
  if (is_random_sort) {
    core::ConfidentialTransaction::RandomSortTxOut(this_00);
  }
  core::ConfidentialNonce::~ConfidentialNonce(&confidential_asset_nonce);
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransactionController::SetAssetReissuance(
    const Txid& txid, uint32_t vout, const Amount& amount,
    const Script& locking_script, const ByteData& asset_nonce,
    const BlindFactor& blind_factor, const BlindFactor& entropy,
    bool is_random_sort, bool is_remove_nonce) {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);

  ConfidentialNonce confidential_asset_nonce;
  if (!is_remove_nonce) {
    confidential_asset_nonce = ConfidentialNonce(asset_nonce);
  }

  IssuanceParameter param;
  param = transaction_.SetAssetReissuance(
      txin_index, amount, locking_script, confidential_asset_nonce,
      blind_factor, entropy);

  if (is_random_sort) {
    RandomSortTxOut();
  }
  return param;
}